

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

int __thiscall
xla::GraphCycles::FindPath(GraphCycles *this,int32_t x,int32_t y,int max_path_len,int32_t *path)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  pointer pNVar2;
  pointer piVar3;
  long lVar4;
  int iVar5;
  Rep *pRVar6;
  pointer piVar7;
  __ireturn_type _Var8;
  int w;
  NodeSet seen;
  int local_88;
  int32_t local_84;
  int local_80;
  int32_t local_7c;
  int32_t *local_78;
  Rep *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pRVar6 = this->rep_;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &pRVar6->stack_;
  piVar7 = (pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar7) {
    (pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
  }
  local_84 = y;
  local_80 = max_path_len;
  local_7c = x;
  local_78 = path;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_7c);
  iVar5 = 0;
  local_70 = pRVar6;
  while (piVar7 = (pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        (pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != piVar7) {
    iVar1 = piVar7[-1];
    lVar4 = (long)iVar1;
    (pRVar6->stack_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7 + -1;
    if (lVar4 < 0) {
      iVar5 = iVar5 + -1;
    }
    else {
      if (iVar5 < local_80) {
        local_78[iVar5] = iVar1;
      }
      local_88 = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&local_88);
      iVar5 = iVar5 + 1;
      if (iVar1 == local_84) goto LAB_00182b51;
      pNVar2 = (pRVar6->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                ((long)&pNVar2[lVar4].out.value_sequence_.
                        super__Vector_base<int,_std::allocator<int>_> + 8);
      for (piVar7 = *(pointer *)
                     &pNVar2[lVar4].out.value_sequence_.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl; pRVar6 = local_70,
          piVar7 != piVar3; piVar7 = piVar7 + 1) {
        local_88 = *piVar7;
        _Var8 = std::__detail::
                _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)&local_68,&local_88);
        if (((undefined1  [16])_Var8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_88);
        }
      }
    }
  }
  iVar5 = 0;
LAB_00182b51:
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return iVar5;
}

Assistant:

int GraphCycles::FindPath(int32_t x, int32_t y, int max_path_len,
                          int32_t path[]) const {
  // Forward depth first search starting at x until we hit y.
  // As we descend into a node, we push it onto the path.
  // As we leave a node, we remove it from the path.
  int path_len = 0;

  Rep* r = rep_;
  NodeSet seen;
  r->stack_.clear();
  r->stack_.push_back(x);
  while (!r->stack_.empty()) {
    int32_t n = r->stack_.back();
    r->stack_.pop_back();
    if (n < 0) {
      // Marker to indicate that we are leaving a node
      path_len--;
      continue;
    }

    if (path_len < max_path_len) {
      path[path_len] = n;
    }
    path_len++;
    r->stack_.push_back(-1);  // Will remove tentative path entry

    if (n == y) {
      return path_len;
    }

    for (auto w : r->node_io_[n].out.GetSequence()) {
      if (seen.insert(w).second) {
        r->stack_.push_back(w);
      }
    }
  }

  return 0;
}